

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node,char *data,int datalen,int options,xmlNodePtr *listOut)

{
  _xmlDoc *p_Var1;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlNodePtr pxVar2;
  xmlParserErrors xVar3;
  
  xVar3 = XML_ERR_INTERNAL_ERROR;
  if (((listOut != (xmlNodePtr *)0x0) &&
      (*listOut = (xmlNodePtr)0x0, -1 < datalen && (data != (char *)0x0 && node != (xmlNodePtr)0x0))
      ) && (p_Var1 = node->doc, p_Var1 != (_xmlDoc *)0x0)) {
    if (p_Var1->type == XML_HTML_DOCUMENT_NODE) {
      ctxt = htmlNewParserCtxt();
    }
    else {
      ctxt = xmlNewParserCtxt();
    }
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      xVar3 = XML_ERR_NO_MEMORY;
    }
    else {
      input = xmlCtxtNewInputFromMemory
                        (ctxt,(char *)0x0,data,(ulong)(uint)datalen,(char *)p_Var1->encoding,
                         XML_INPUT_BUF_STATIC);
      xVar3 = XML_ERR_NO_MEMORY;
      if (input != (xmlParserInputPtr)0x0) {
        xmlCtxtUseOptions(ctxt,options);
        pxVar2 = xmlCtxtParseContent(ctxt,input,node,0);
        if (pxVar2 == (xmlNodePtr)0x0) {
          xVar3 = XML_ERR_INTERNAL_ERROR;
          if (ctxt->errNo != XML_ERR_ARGUMENT) {
            xVar3 = ctxt->errNo;
          }
        }
        else {
          *listOut = pxVar2;
          xVar3 = XML_ERR_OK;
        }
      }
      xmlFreeParserCtxt(ctxt);
    }
  }
  return xVar3;
}

Assistant:

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node, const char *data, int datalen,
                      int options, xmlNodePtr *listOut) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc;
    xmlNodePtr list;
    xmlParserErrors ret;

    if (listOut == NULL)
        return(XML_ERR_INTERNAL_ERROR);
    *listOut = NULL;

    if ((node == NULL) || (data == NULL) || (datalen < 0))
        return(XML_ERR_INTERNAL_ERROR);

    doc = node->doc;
    if (doc == NULL)
        return(XML_ERR_INTERNAL_ERROR);

#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        ctxt = htmlNewParserCtxt();
    }
    else
#endif
        ctxt = xmlNewParserCtxt();

    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, data, datalen,
                                      (const char *) doc->encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL) {
        xmlFreeParserCtxt(ctxt);
        return(XML_ERR_NO_MEMORY);
    }

    xmlCtxtUseOptions(ctxt, options);

    list = xmlCtxtParseContent(ctxt, input, node, /* hasTextDecl */ 0);

    if (list == NULL) {
        ret = ctxt->errNo;
        if (ret == XML_ERR_ARGUMENT)
            ret = XML_ERR_INTERNAL_ERROR;
    } else {
        ret = XML_ERR_OK;
        *listOut = list;
    }

    xmlFreeParserCtxt(ctxt);

    return(ret);
}